

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O2

int h264_pred_weight_table_entry
              (bitstream *str,h264_pred_weight_table *table,h264_pred_weight_table_entry *entry)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = vs_u(str,&entry->luma_weight_flag,1);
  if (entry->luma_weight_flag == 0) {
    uVar2 = vs_infers(str,&entry->luma_weight,1 << ((byte)table->luma_log2_weight_denom & 0x1f));
    uVar3 = vs_infers(str,&entry->luma_offset,0);
  }
  else {
    uVar2 = vs_se(str,&entry->luma_weight);
    uVar3 = vs_se(str,&entry->luma_offset);
  }
  uVar4 = vs_u(str,&entry->chroma_weight_flag,1);
  if (entry->chroma_weight_flag == 0) {
    uVar5 = vs_infers(str,entry->chroma_weight,1 << ((byte)table->chroma_log2_weight_denom & 0x1f));
    uVar6 = vs_infers(str,entry->chroma_offset,0);
    uVar6 = uVar6 | uVar5;
    uVar5 = vs_infers(str,entry->chroma_weight + 1,
                      1 << ((byte)table->chroma_log2_weight_denom & 0x1f));
    uVar7 = vs_infers(str,entry->chroma_offset + 1,0);
  }
  else {
    uVar5 = vs_se(str,entry->chroma_weight);
    uVar6 = vs_se(str,entry->chroma_offset);
    uVar6 = uVar6 | uVar5;
    uVar5 = vs_se(str,entry->chroma_weight + 1);
    uVar7 = vs_se(str,entry->chroma_offset + 1);
  }
  return uVar3 | uVar2 | uVar1 | uVar4 | uVar7 | uVar5 | uVar6;
}

Assistant:

int h264_pred_weight_table_entry(struct bitstream *str, struct h264_pred_weight_table *table, struct h264_pred_weight_table_entry *entry) {
	int ret = 0;
	ret |= vs_u(str, &entry->luma_weight_flag, 1);
	if (entry->luma_weight_flag) {
		ret |= vs_se(str, &entry->luma_weight);
		ret |= vs_se(str, &entry->luma_offset);
	} else {
		ret |= vs_infers(str, &entry->luma_weight, 1 << table->luma_log2_weight_denom);
		ret |= vs_infers(str, &entry->luma_offset, 0);
	}
	ret |= vs_u(str, &entry->chroma_weight_flag, 1);
	if (entry->chroma_weight_flag) {
		ret |= vs_se(str, &entry->chroma_weight[0]);
		ret |= vs_se(str, &entry->chroma_offset[0]);
		ret |= vs_se(str, &entry->chroma_weight[1]);
		ret |= vs_se(str, &entry->chroma_offset[1]);
	} else {
		ret |= vs_infers(str, &entry->chroma_weight[0], 1 << table->chroma_log2_weight_denom);
		ret |= vs_infers(str, &entry->chroma_offset[0], 0);
		ret |= vs_infers(str, &entry->chroma_weight[1], 1 << table->chroma_log2_weight_denom);
		ret |= vs_infers(str, &entry->chroma_offset[1], 0);
	}
	return ret;
}